

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O0

err_t btokKeypairVal(octet *privkey,size_t privkey_len,octet *pubkey,size_t pubkey_len)

{
  long in_RCX;
  long in_RSI;
  bign_params params [1];
  err_t code;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  bign_params *in_stack_fffffffffffffe78;
  octet *in_stack_fffffffffffffe98;
  octet *in_stack_fffffffffffffea0;
  bign_params *in_stack_fffffffffffffea8;
  octet *in_stack_fffffffffffffeb0;
  bign_params *in_stack_fffffffffffffeb8;
  undefined4 local_4;
  
  if (in_RCX == in_RSI * 2) {
    local_4 = btokParamsStd(in_stack_fffffffffffffe78,
                            CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    if (local_4 == 0) {
      if (in_RSI == 0x18) {
        local_4 = bign96KeypairVal(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                                   in_stack_fffffffffffffe98);
      }
      else {
        local_4 = bignKeypairVal(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                                 (octet *)in_stack_fffffffffffffea8);
      }
    }
  }
  else {
    local_4 = 0x1fa;
  }
  return local_4;
}

Assistant:

static err_t btokKeypairVal(const octet privkey[], size_t privkey_len,
	const octet pubkey[], size_t pubkey_len)
{
	err_t code;
	bign_params params[1];
	// входной еонтроль
	if (pubkey_len != 2 * privkey_len)
		return ERR_BAD_KEYPAIR;
	// загрузить параметры
	code = btokParamsStd(params, privkey_len);
	ERR_CALL_CHECK(code);
	// проверить пару ключей
	return privkey_len == 24 ? bign96KeypairVal(params, privkey, pubkey) :
		bignKeypairVal(params, privkey, pubkey);
}